

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall CChat::AddLine(CChat *this,char *pLine,int ClientID,int Mode,int TargetID)

{
  char *buffer;
  uint uVar1;
  CGameClient *pCVar2;
  IConsole *pIVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int64 iVar9;
  int64 iVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  long in_FS_OFFSET;
  char *pStr;
  char aBuf [1024];
  char *local_440;
  char local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*pLine != '\0') && ((ClientID < 1 || (bVar6 = IsClientIgnored(this,ClientID), !bVar6)))) &&
     ((Mode != 3 ||
      (((-1 < (TargetID | ClientID) && (bVar6 = IsClientIgnored(this,TargetID), !bVar6)) &&
       (iVar15 = ((this->super_CComponent).m_pClient)->m_LocalClientID,
       iVar15 == ClientID || iVar15 == TargetID)))))) {
    iVar15 = 0x7f;
    pcVar13 = (char *)0x0;
    local_440 = pLine;
    do {
      pcVar11 = local_440;
      if (*local_440 == '\0') goto LAB_00135eeb;
      iVar8 = str_utf8_decode(&local_440);
      iVar8 = str_utf8_is_whitespace(iVar8);
      if (pcVar13 != (char *)0x0) {
        pcVar11 = pcVar13;
      }
      pcVar13 = (char *)0x0;
      if (iVar8 != 0) {
        pcVar13 = pcVar11;
      }
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    *local_440 = '\0';
LAB_00135eeb:
    if (pcVar13 != (char *)0x0) {
      *pcVar13 = '\0';
    }
    cVar7 = *pLine;
    if (cVar7 == '\0') {
      bVar6 = false;
    }
    else {
      pcVar13 = pLine;
LAB_00135f43:
      do {
        pcVar11 = pLine + 1;
        if (cVar7 == '\n') {
          *pLine = '\0';
        }
        else {
          cVar7 = *pcVar11;
          pLine = pcVar11;
          if (cVar7 != '\0') goto LAB_00135f43;
        }
        iVar15 = this->m_CurrentLine + ((this->m_CurrentLine + 1) / 0xfa) * -0xfa + 1;
        this->m_CurrentLine = iVar15;
        iVar9 = time_get();
        this->m_aLines[iVar15].m_Time = iVar9;
        this->m_aLines[iVar15].m_Size.field_1.y = -1.0;
        this->m_aLines[iVar15].m_ClientID = ClientID;
        this->m_aLines[iVar15].m_TargetID = TargetID;
        this->m_aLines[iVar15].m_Mode = Mode;
        this->m_aLines[iVar15].m_NameColor = -2;
        uVar5 = ClientID;
        if (ClientID < 0 || Mode == 3) {
          this->m_aLines[iVar15].m_Highlighted = false;
          if (Mode == 3) {
            if (((this->super_CComponent).m_pClient)->m_LocalClientID == ClientID) {
              uVar5 = TargetID;
            }
            if (TargetID < 0) {
              uVar5 = ClientID;
            }
            bVar6 = false;
          }
          else {
            bVar6 = false;
          }
        }
        else {
          pCVar2 = (this->super_CComponent).m_pClient;
          iVar8 = pCVar2->m_LocalClientID;
          if (iVar8 == ClientID) {
            bVar6 = false;
          }
          else {
            pcVar12 = str_find_nocase(pcVar13,pCVar2->m_aClients[iVar8].m_aName);
            if (pcVar12 == (char *)0x0) {
              bVar6 = false;
            }
            else {
              pCVar2 = (this->super_CComponent).m_pClient;
              iVar8 = str_length(pCVar2->m_aClients[pCVar2->m_LocalClientID].m_aName);
              if ((pcVar13 == pcVar12) || (pcVar12[-1] == ' ')) {
                bVar6 = (pcVar12[iVar8] & 0xdfU) == 0;
                if ((pcVar12[iVar8] == 0x3a) && ((pcVar12[(long)iVar8 + 1] & 0xdfU) == 0)) {
                  bVar6 = true;
                }
              }
              else {
                bVar6 = false;
              }
              this->m_CompletionFav = ClientID;
            }
          }
          this->m_aLines[iVar15].m_Highlighted = bVar6;
        }
        if (ClientID == -2) {
          this->m_aLines[iVar15].m_aName[0] = '\0';
          pcVar12 = anon_var_dwarf_48a0f;
        }
        else if (ClientID == -1) {
          this->m_aLines[iVar15].m_aName[0] = '\0';
          pcVar12 = "*** %s";
        }
        else {
          pCVar2 = (this->super_CComponent).m_pClient;
          uVar1 = pCVar2->m_aClients[ClientID].m_Team;
          if (uVar1 == 0xffffffff) {
            this->m_aLines[iVar15].m_NameColor = -1;
          }
          if (uVar1 < 2 && ((pCVar2->m_GameInfo).m_GameFlags & 1) != 0) {
            this->m_aLines[iVar15].m_NameColor = uVar1;
          }
          str_format(this->m_aLines[iVar15].m_aName,0x41,"%s",pCVar2->m_aClients + (int)uVar5);
          pcVar12 = "%s";
        }
        buffer = this->m_aLines[iVar15].m_aText;
        str_format(buffer,0x200,pcVar12,pcVar13);
        str_format(local_438,0x400,"%2d: %s: %s",(ulong)uVar5,this->m_aLines[iVar15].m_aName,buffer)
        ;
        pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
        pcVar13 = "";
        if (Mode - 1U < 3) {
          pcVar13 = *(char **)(&DAT_00211c20 + (ulong)(Mode - 1U) * 8);
        }
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar3,0,pcVar13,local_438,(ulong)(byte)(Mode == 3 | bVar6));
        cVar7 = *pcVar11;
        pLine = pcVar11;
        pcVar13 = pcVar11;
      } while (cVar7 != '\0');
    }
    pCVar2 = (this->super_CComponent).m_pClient;
    if ((Mode == 3) && (pCVar2->m_LocalClientID != ClientID)) {
      this->m_LastWhisperFrom = ClientID;
    }
    if (pCVar2->m_pConfig->m_ClShowChat != 0) {
      uVar5 = 0;
      if (-1 < ClientID) {
        uVar5 = 2 - (byte)(Mode == 3 | bVar6);
      }
      uVar14 = (ulong)uVar5;
      iVar9 = time_get();
      lVar4 = this->m_aLastSoundPlayed[uVar14];
      iVar10 = time_freq();
      if ((float)iVar10 * 0.3 <= (float)(iVar9 - lVar4)) {
        CSounds::Play(((this->super_CComponent).m_pClient)->m_pSounds,0,
                      *(int *)(&DAT_001d9238 + uVar14 * 4),0.0);
        this->m_aLastSoundPlayed[uVar14] = iVar9;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CChat::AddLine(const char *pLine, int ClientID, int Mode, int TargetID)
{
	if(*pLine == 0 || (ClientID > 0 && IsClientIgnored(ClientID)))
		return;

	if(Mode == CHAT_WHISPER)
	{
		if(ClientID < 0 || TargetID < 0 || IsClientIgnored(TargetID))
			return;
		// should be sender or receiver
		if(ClientID != m_pClient->m_LocalClientID && TargetID != m_pClient->m_LocalClientID)
			return;
	}

	// trim right and set maximum length to 128 utf8-characters
	int Length = 0;
	const char *pStr = pLine;
	const char *pEnd = 0;
	while(*pStr)
	{
		const char *pStrOld = pStr;
		int Code = str_utf8_decode(&pStr);

		// check if unicode is not empty
		if(!str_utf8_is_whitespace(Code))
		{
			pEnd = 0;
		}
		else if(pEnd == 0)
			pEnd = pStrOld;

		if(++Length >= 127)
		{
			*(const_cast<char *>(pStr)) = 0;
			break;
		}
	}
	if(pEnd != 0)
		*(const_cast<char *>(pEnd)) = 0;

	bool Highlighted = false;
	char *p = const_cast<char*>(pLine);
	while(*p)
	{
		pLine = p;
		// find line separator and strip multiline
		while(*p)
		{
			if(*p++ == '\n')
			{
				*(p-1) = 0;
				break;
			}
		}

		m_CurrentLine = (m_CurrentLine+1)%MAX_LINES;
		CLine *pCurLine = &m_aLines[m_CurrentLine];

		pCurLine->m_Time = time_get();
		pCurLine->m_Size.y = -1.0f;
		pCurLine->m_ClientID = ClientID;
		pCurLine->m_TargetID = TargetID;
		pCurLine->m_Mode = Mode;
		pCurLine->m_NameColor = -2;

		// check for highlighted name
		Highlighted = false;
		// do not highlight our own messages, whispers and system messages
		if(Mode != CHAT_WHISPER && ClientID >= 0 && ClientID != m_pClient->m_LocalClientID)
		{
			const char *pHL = str_find_nocase(pLine, m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
			if(pHL)
			{
				int Length = str_length(m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
				if((pLine == pHL || pHL[-1] == ' ')) // "" or " " before
				{
					if((pHL[Length] == 0 || pHL[Length] == ' ')) // "" or " " after
						Highlighted = true;
					if(pHL[Length] == ':' && (pHL[Length+1] == 0 || pHL[Length+1] == ' ')) // ":" or ": " after
						Highlighted = true;
				}
				m_CompletionFav = ClientID;
			}
		}

		pCurLine->m_Highlighted =  Highlighted;

		int NameCID = ClientID;
		if(Mode == CHAT_WHISPER && ClientID == m_pClient->m_LocalClientID && TargetID >= 0)
			NameCID = TargetID;

		if(ClientID == SERVER_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "*** %s", pLine);
		}
		else if(ClientID == CLIENT_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "— %s", pLine);
		}
		else
		{
			if(m_pClient->m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
				pCurLine->m_NameColor = TEAM_SPECTATORS;

			if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS)
			{
				if(m_pClient->m_aClients[ClientID].m_Team == TEAM_RED)
					pCurLine->m_NameColor = TEAM_RED;
				else if(m_pClient->m_aClients[ClientID].m_Team == TEAM_BLUE)
					pCurLine->m_NameColor = TEAM_BLUE;
			}

			str_format(pCurLine->m_aName, sizeof(pCurLine->m_aName), "%s", m_pClient->m_aClients[NameCID].m_aName);
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "%s", pLine);
		}

		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "%2d: %s: %s", NameCID, pCurLine->m_aName, pCurLine->m_aText);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, GetModeName(Mode), aBuf, Highlighted || Mode == CHAT_WHISPER);
	}

	if(Mode == CHAT_WHISPER && m_pClient->m_LocalClientID != ClientID)
		m_LastWhisperFrom = ClientID; // we received a whisper

	// play sound
	if(Config()->m_ClShowChat)
	{
		int ChatType;
		if(ClientID < 0)
			ChatType = CHAT_SERVER;
		else if(Highlighted || Mode == CHAT_WHISPER)
			ChatType = CHAT_HIGHLIGHT;
		else
			ChatType = CHAT_CLIENT;

		const int64 Now = time_get();
		if(Now - m_aLastSoundPlayed[ChatType] >= time_freq() * 0.3f)
		{
			m_pClient->m_pSounds->Play(CSounds::CHN_GUI, GetChatSound(ChatType), 0);
			m_aLastSoundPlayed[ChatType] = Now;
		}
	}
}